

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeRange.cpp
# Opt level: O0

bool FIX::TimeRange::isInRange
               (DateTime *startTime,DateTime *endTime,int startDay,int endDay,DateTime *time,int day
               )

{
  bool bVar1;
  undefined1 local_50 [8];
  UtcTimeOnly timeOnly;
  int day_local;
  DateTime *time_local;
  int endDay_local;
  int startDay_local;
  DateTime *endTime_local;
  DateTime *startTime_local;
  
  timeOnly.super_DateTime.m_time._4_4_ = day;
  UtcTimeOnly::UtcTimeOnly((UtcTimeOnly *)local_50,time);
  if (startDay == endDay) {
    if (timeOnly.super_DateTime.m_time._4_4_ == startDay) {
      startTime_local._7_1_ = isInRange(startTime,endTime,time);
    }
    else {
      startTime_local._7_1_ = true;
    }
    goto LAB_002d1848;
  }
  if (startDay < endDay) {
    if ((timeOnly.super_DateTime.m_time._4_4_ < startDay) ||
       (endDay < timeOnly.super_DateTime.m_time._4_4_)) {
      startTime_local._7_1_ = false;
      goto LAB_002d1848;
    }
    if ((timeOnly.super_DateTime.m_time._4_4_ == startDay) &&
       (bVar1 = operator<((DateTime *)local_50,startTime), bVar1)) {
      startTime_local._7_1_ = false;
      goto LAB_002d1848;
    }
    if ((timeOnly.super_DateTime.m_time._4_4_ == endDay) &&
       (bVar1 = operator>((DateTime *)local_50,endTime), bVar1)) {
      startTime_local._7_1_ = false;
      goto LAB_002d1848;
    }
  }
  else if (endDay < startDay) {
    if ((timeOnly.super_DateTime.m_time._4_4_ < startDay) &&
       (endDay < timeOnly.super_DateTime.m_time._4_4_)) {
      startTime_local._7_1_ = false;
      goto LAB_002d1848;
    }
    if ((timeOnly.super_DateTime.m_time._4_4_ == startDay) &&
       (bVar1 = operator<((DateTime *)local_50,startTime), bVar1)) {
      startTime_local._7_1_ = false;
      goto LAB_002d1848;
    }
    if ((timeOnly.super_DateTime.m_time._4_4_ == endDay) &&
       (bVar1 = operator>((DateTime *)local_50,endTime), bVar1)) {
      startTime_local._7_1_ = false;
      goto LAB_002d1848;
    }
  }
  startTime_local._7_1_ = true;
LAB_002d1848:
  UtcTimeOnly::~UtcTimeOnly((UtcTimeOnly *)local_50);
  return startTime_local._7_1_;
}

Assistant:

bool TimeRange::isInRange(
    const DateTime &startTime,
    const DateTime &endTime,
    int startDay,
    int endDay,
    const DateTime &time,
    int day) {
  UtcTimeOnly timeOnly(time);

  if (startDay == endDay) {
    if (day != startDay) {
      return true;
    }
    return isInRange(startTime, endTime, time);
  } else if (startDay < endDay) {
    if (day < startDay || day > endDay) {
      return false;
    } else if (day == startDay && timeOnly < startTime) {
      return false;
    } else if (day == endDay && timeOnly > endTime) {
      return false;
    }
  } else if (startDay > endDay) {
    if (day < startDay && day > endDay) {
      return false;
    } else if (day == startDay && timeOnly < startTime) {
      return false;
    } else if (day == endDay && timeOnly > endTime) {
      return false;
    }
  }
  return true;
}